

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ScalarReplacementPass::TransferAnnotations
          (ScalarReplacementPass *this,Instruction *source,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  Instruction *this_00;
  Instruction *this_01;
  ScalarReplacementPass *this_02;
  uint32_t uVar1;
  uint32_t uVar2;
  DecorationManager *this_03;
  Instruction *this_04;
  Operand *pOVar3;
  DefUseManager *this_05;
  pointer ppIVar4;
  uint32_t i;
  long lVar5;
  pointer *__ptr;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_168;
  uint32_t local_15c;
  uint32_t local_158;
  uint32_t local_154;
  ScalarReplacementPass *local_150;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_148;
  pointer local_140;
  pointer local_138;
  pointer local_130;
  IRContext *local_128;
  pointer local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  Operand copy;
  SmallVector<unsigned_int,_2UL> local_c0;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_98
  ;
  SmallVector<unsigned_int,_2UL> local_80;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_150 = this;
  local_148 = replacements;
  this_03 = Pass::get_decoration_mgr((Pass *)this);
  uVar1 = Instruction::result_id(source);
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_98,this_03,uVar1,false);
  local_140 = local_98._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (local_98._M_impl.super__Vector_impl_data._M_start == local_140) {
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&local_98);
      return;
    }
    this_00 = *local_98._M_impl.super__Vector_impl_data._M_start;
    local_138 = local_98._M_impl.super__Vector_impl_data._M_start;
    if (this_00->opcode_ != OpDecorate) break;
    local_15c = Instruction::GetSingleWordInOperand(this_00,1);
    if ((local_15c & 0xfffffffe) == 0x12) {
      local_130 = (local_148->
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar4 = (local_148->
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; ppIVar4 != local_130;
          ppIVar4 = ppIVar4 + 1) {
        this_01 = *ppIVar4;
        if (this_01 != (Instruction *)0x0) {
          local_120 = ppIVar4;
          this_04 = (Instruction *)::operator_new(0x70);
          local_128 = (local_150->super_MemPass).super_Pass.context_;
          local_154 = Instruction::result_id(this_01);
          init_list._M_len = 1;
          init_list._M_array = &local_154;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
          copy.type = SPV_OPERAND_TYPE_ID;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&copy.words,&local_58);
          local_158 = local_15c;
          init_list_00._M_len = 1;
          init_list_00._M_array = &local_158;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_80,init_list_00);
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,&local_80);
          local_118 = 0;
          uStack_110 = 0;
          local_108 = 0;
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          _M_range_initialize<spvtools::opt::Operand_const*>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &local_118,&copy,&local_98);
          Instruction::Instruction(this_04,local_128,OpDecorate,0,0,(OperandList *)&local_118);
          local_168._M_head_impl = this_04;
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     &local_118);
          lVar5 = 0x38;
          do {
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                      ((SmallVector<unsigned_int,_2UL> *)((long)(copy.words.buffer + -6) + lVar5));
            lVar5 = lVar5 + -0x30;
          } while (lVar5 != -0x28);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_80);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
          for (uVar1 = 2; uVar2 = Instruction::NumInOperands(this_00), this_02 = local_150,
              uVar1 < uVar2; uVar1 = uVar1 + 1) {
            pOVar3 = Instruction::GetInOperand(this_00,uVar1);
            Operand::Operand(&copy,pOVar3);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
            emplace_back<spvtools::opt::Operand>(&(local_168._M_head_impl)->operands_,&copy);
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&copy.words);
          }
          IRContext::AddAnnotationInst
                    ((local_150->super_MemPass).super_Pass.context_,
                     (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&local_168);
          this_05 = Pass::get_def_use_mgr((Pass *)this_02);
          analysis::DefUseManager::AnalyzeInstUse
                    (this_05,(((((this_02->super_MemPass).super_Pass.context_)->module_)._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)
                             ->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.
                             sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                             previous_node_);
          ppIVar4 = local_120;
          if (local_168._M_head_impl != (Instruction *)0x0) {
            (*((local_168._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
              _vptr_IntrusiveNodeBase[1])();
            ppIVar4 = local_120;
          }
        }
      }
    }
    local_98._M_impl.super__Vector_impl_data._M_start = local_138 + 1;
  }
  __assert_fail("inst->opcode() == spv::Op::OpDecorate",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x1bd,
                "void spvtools::opt::ScalarReplacementPass::TransferAnnotations(const Instruction *, std::vector<Instruction *> *)"
               );
}

Assistant:

void ScalarReplacementPass::TransferAnnotations(
    const Instruction* source, std::vector<Instruction*>* replacements) {
  // Only transfer invariant and restrict decorations on the variable. There are
  // no type or member decorations that are necessary to transfer.
  for (auto inst :
       get_decoration_mgr()->GetDecorationsFor(source->result_id(), false)) {
    assert(inst->opcode() == spv::Op::OpDecorate);
    auto decoration = spv::Decoration(inst->GetSingleWordInOperand(1u));
    if (decoration == spv::Decoration::Invariant ||
        decoration == spv::Decoration::Restrict) {
      for (auto var : *replacements) {
        if (var == nullptr) {
          continue;
        }

        std::unique_ptr<Instruction> annotation(new Instruction(
            context(), spv::Op::OpDecorate, 0, 0,
            std::initializer_list<Operand>{
                {SPV_OPERAND_TYPE_ID, {var->result_id()}},
                {SPV_OPERAND_TYPE_DECORATION, {uint32_t(decoration)}}}));
        for (uint32_t i = 2; i < inst->NumInOperands(); ++i) {
          Operand copy(inst->GetInOperand(i));
          annotation->AddOperand(std::move(copy));
        }
        context()->AddAnnotationInst(std::move(annotation));
        get_def_use_mgr()->AnalyzeInstUse(&*--context()->annotation_end());
      }
    }
  }
}